

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

FieldSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::addMemberSchema
          (FieldSourceInfoBuilderPair *__return_storage_ptr__,MemberInfo *this)

{
  bool bVar1;
  FieldSourceInfoBuilderPair *result;
  Builder local_148;
  Builder local_120;
  Builder local_f8;
  Builder local_d0;
  Builder local_a8;
  undefined1 local_80 [8];
  Builder structNode;
  Fault local_48;
  Fault f;
  undefined1 local_38 [8];
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition;
  MemberInfo *this_local;
  
  _kjCondition._32_8_ = this;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->childInitializedCount
                          );
  kj::_::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_38,
             (DebugExpression<unsigned_int&> *)&f,&this->childCount);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x474,FAILED,"childInitializedCount < childCount","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_38);
    kj::_::Debug::Fault::fatal(&local_48);
  }
  capnp::schema::Node::Builder::getStruct((Builder *)local_80,&this->node);
  bVar1 = capnp::schema::Node::Struct::Builder::hasFields((Builder *)local_80);
  if (bVar1) {
    capnp::schema::Node::Struct::Builder::getFields(&local_120,(Builder *)local_80);
    List<capnp::schema::Field,_(capnp::Kind)3>::Builder::operator[]
              (&__return_storage_ptr__->field,&local_120,this->childInitializedCount);
    capnp::schema::Node::SourceInfo::Builder::getMembers(&local_148,&this->sourceInfo);
    List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Builder::operator[]
              (&__return_storage_ptr__->sourceInfo,&local_148,this->childInitializedCount);
    this->childInitializedCount = this->childInitializedCount + 1;
  }
  else {
    if (this->parent != (MemberInfo *)0x0) {
      getSchema(&local_a8,this);
    }
    capnp::schema::Node::Struct::Builder::initFields(&local_d0,(Builder *)local_80,this->childCount)
    ;
    List<capnp::schema::Field,_(capnp::Kind)3>::Builder::operator[]
              (&__return_storage_ptr__->field,&local_d0,this->childInitializedCount);
    capnp::schema::Node::SourceInfo::Builder::initMembers
              (&local_f8,&this->sourceInfo,this->childCount);
    List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Builder::operator[]
              (&__return_storage_ptr__->sourceInfo,&local_f8,this->childInitializedCount);
    this->childInitializedCount = this->childInitializedCount + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

addMemberSchema() {
      // Get the schema builder for the child member at the given index.  This lazily/dynamically
      // builds the builder tree.

      KJ_REQUIRE(childInitializedCount < childCount);

      auto structNode = node.getStruct();
      if (!structNode.hasFields()) {
        if (parent != nullptr) {
          getSchema();  // Make sure field exists in parent once the first child is added.
        }
        FieldSourceInfoBuilderPair result {
          structNode.initFields(childCount)[childInitializedCount],
          sourceInfo.initMembers(childCount)[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      } else {
        FieldSourceInfoBuilderPair result {
          structNode.getFields()[childInitializedCount],
          sourceInfo.getMembers()[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      }
    }